

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest::ComparisonTest(ComparisonTest *this)

{
  UnknownFieldSet *pUVar1;
  ComparisonTest *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ComparisonTest_02a252c0;
  proto2_unittest::TestAllTypes::TestAllTypes(&this->proto1_);
  proto2_unittest::TestAllTypes::TestAllTypes(&this->proto2_);
  proto2_unittest::TestFieldOrderings::TestFieldOrderings(&this->orderings_proto1_);
  proto2_unittest::TestFieldOrderings::TestFieldOrderings(&this->orderings_proto2_);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&this->proto1ex_);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&this->proto2ex_);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&this->proto1diff_);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&this->proto2diff_);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage(&this->empty1_);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage(&this->empty2_);
  proto2_unittest::TestMap::TestMap(&this->map_proto1_);
  proto2_unittest::TestMap::TestMap(&this->map_proto2_);
  this->use_equivalency_ = false;
  this->repeated_field_as_set_ = false;
  std::__cxx11::string::string((string *)&this->set_field_);
  std::__cxx11::string::string((string *)&this->map_field_);
  std::__cxx11::string::string((string *)&this->map_key_);
  std::__cxx11::string::string((string *)&this->ignored_field_);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&this->proto1_);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&this->proto2_);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&this->proto1ex_);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&this->proto2ex_);
  TestUtil::SetAllFieldsAndExtensions<proto2_unittest::TestFieldOrderings>(&this->orderings_proto1_)
  ;
  TestUtil::SetAllFieldsAndExtensions<proto2_unittest::TestFieldOrderings>(&this->orderings_proto2_)
  ;
  pUVar1 = proto2_unittest::TestEmptyMessage::mutable_unknown_fields(&this->empty1_);
  this->unknown1_ = pUVar1;
  pUVar1 = proto2_unittest::TestEmptyMessage::mutable_unknown_fields(&this->empty2_);
  this->unknown2_ = pUVar1;
  return;
}

Assistant:

ComparisonTest() : use_equivalency_(false), repeated_field_as_set_(false) {
    // Setup the test.
    TestUtil::SetAllFields(&proto1_);
    TestUtil::SetAllFields(&proto2_);

    TestUtil::SetAllExtensions(&proto1ex_);
    TestUtil::SetAllExtensions(&proto2ex_);

    TestUtil::SetAllFieldsAndExtensions(&orderings_proto1_);
    TestUtil::SetAllFieldsAndExtensions(&orderings_proto2_);

    unknown1_ = empty1_.mutable_unknown_fields();
    unknown2_ = empty2_.mutable_unknown_fields();
  }